

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnFunctionBodyCount(BinaryReaderIR *this,Index count)

{
  Module *pMVar1;
  bool bVar2;
  
  pMVar1 = this->module_;
  bVar2 = (long)(pMVar1->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pMVar1->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3 !=
          (ulong)(count + pMVar1->num_func_imports);
  if (bVar2) {
    PrintError(this,
               "number of imported func + func count in code section does not match actual number of funcs in module"
              );
  }
  return (Result)(uint)bVar2;
}

Assistant:

Result BinaryReaderIR::OnFunctionBodyCount(Index count) {
  // Can hit this case on a malformed module if we don't stop on first error.
  if (module_->num_func_imports + count != module_->funcs.size()) {
    PrintError(
        "number of imported func + func count in code section does not match "
        "actual number of funcs in module");
    return Result::Error;
  }
  return Result::Ok;
}